

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.cpp
# Opt level: O1

bool llvm::formatv_object_base::consumeFieldLayout
               (StringRef *Spec,AlignStyle *Where,size_t *Align,char *Pad)

{
  char cVar1;
  bool bVar2;
  size_t in_RAX;
  size_t sVar3;
  char *pcVar4;
  AlignStyle AVar5;
  size_t local_18;
  unsigned_long_long ULLVal;
  
  *Where = Right;
  *Align = 0;
  *Pad = ' ';
  sVar3 = Spec->Length;
  if (sVar3 == 0) {
    return true;
  }
  if (sVar3 == 1) goto LAB_00dae8ac;
  pcVar4 = Spec->Data;
  cVar1 = pcVar4[1];
  bVar2 = true;
  if (cVar1 == '+') {
    AVar5 = Right;
  }
  else {
    if (cVar1 != '-') {
      if (cVar1 == '=') {
        AVar5 = Center;
        goto LAB_00dae846;
      }
      bVar2 = false;
    }
    AVar5 = Left;
  }
LAB_00dae846:
  cVar1 = *pcVar4;
  if (bVar2) {
    *Pad = cVar1;
    *Where = AVar5;
    if (Spec->Length < 2) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                    ,0x281,"StringRef llvm::StringRef::drop_front(size_t) const");
    }
    pcVar4 = Spec->Data + 2;
    sVar3 = Spec->Length - 2;
  }
  else {
    bVar2 = true;
    if (cVar1 == '+') {
      AVar5 = Right;
    }
    else {
      if (cVar1 != '-') {
        if (cVar1 == '=') {
          AVar5 = Center;
          goto LAB_00dae898;
        }
        bVar2 = false;
      }
      AVar5 = Left;
    }
LAB_00dae898:
    if (!bVar2) goto LAB_00dae8ac;
    pcVar4 = pcVar4 + 1;
    *Where = AVar5;
    sVar3 = sVar3 - 1;
  }
  Spec->Data = pcVar4;
  Spec->Length = sVar3;
LAB_00dae8ac:
  local_18 = in_RAX;
  bVar2 = consumeUnsignedInteger(Spec,0,&local_18);
  if (!bVar2) {
    *Align = local_18;
  }
  return !bVar2;
}

Assistant:

bool formatv_object_base::consumeFieldLayout(StringRef &Spec, AlignStyle &Where,
                                             size_t &Align, char &Pad) {
  Where = AlignStyle::Right;
  Align = 0;
  Pad = ' ';
  if (Spec.empty())
    return true;

  if (Spec.size() > 1) {
    // A maximum of 2 characters at the beginning can be used for something
    // other
    // than the width.
    // If Spec[1] is a loc char, then Spec[0] is a pad char and Spec[2:...]
    // contains the width.
    // Otherwise, if Spec[0] is a loc char, then Spec[1:...] contains the width.
    // Otherwise, Spec[0:...] contains the width.
    if (auto Loc = translateLocChar(Spec[1])) {
      Pad = Spec[0];
      Where = *Loc;
      Spec = Spec.drop_front(2);
    } else if (auto Loc = translateLocChar(Spec[0])) {
      Where = *Loc;
      Spec = Spec.drop_front(1);
    }
  }

  bool Failed = Spec.consumeInteger(0, Align);
  return !Failed;
}